

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O2

void __thiscall
duckdb::PipelineExecutor::FinishProcessing(PipelineExecutor *this,int32_t operator_idx)

{
  int32_t iVar1;
  pointer pGVar2;
  PhysicalOperator *pPVar3;
  pointer pGVar4;
  Pipeline *pPVar5;
  unique_lock<std::mutex> guard;
  optional_ptr<duckdb::PhysicalOperator,_true> local_68;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  
  iVar1 = 0x7fffffff;
  if ((uint)operator_idx < 0x7fffffff) {
    iVar1 = operator_idx;
  }
  this->finished_processing_idx = iVar1;
  ::std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
            ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &local_60);
  ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign1
            (&(this->in_process_operators).c,&local_60);
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_60);
  pPVar5 = this->pipeline;
  if ((pPVar5->source).ptr != (PhysicalOperator *)0x0) {
    pGVar2 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
             ::operator->(&pPVar5->source_state);
    ::std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&local_60,&(pGVar2->super_StateWithBlockableTasks).lock);
    pGVar2 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
             ::operator->(&this->pipeline->source_state);
    LOCK();
    (pGVar2->super_StateWithBlockableTasks).can_block._M_base._M_i = false;
    UNLOCK();
    pGVar2 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
             ::operator->(&this->pipeline->source_state);
    StateWithBlockableTasks::UnblockTasks
              (&pGVar2->super_StateWithBlockableTasks,(unique_lock<std::mutex> *)&local_60);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_60);
    pPVar5 = this->pipeline;
  }
  local_68.ptr = (pPVar5->sink).ptr;
  if (local_68.ptr != (PhysicalOperator *)0x0) {
    pPVar3 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&local_68);
    pGVar4 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator->(&pPVar3->sink_state);
    ::std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&local_60,&(pGVar4->super_StateWithBlockableTasks).lock);
    local_68.ptr = (this->pipeline->sink).ptr;
    pPVar3 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&local_68);
    pGVar4 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator->(&pPVar3->sink_state);
    LOCK();
    (pGVar4->super_StateWithBlockableTasks).can_block._M_base._M_i = false;
    UNLOCK();
    local_68.ptr = (this->pipeline->sink).ptr;
    pPVar3 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&local_68);
    pGVar4 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator->(&pPVar3->sink_state);
    StateWithBlockableTasks::UnblockTasks
              (&pGVar4->super_StateWithBlockableTasks,(unique_lock<std::mutex> *)&local_60);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_60);
  }
  return;
}

Assistant:

void PipelineExecutor::FinishProcessing(int32_t operator_idx) {
	finished_processing_idx = operator_idx < 0 ? NumericLimits<int32_t>::Maximum() : operator_idx;
	in_process_operators = stack<idx_t>();

	if (pipeline.GetSource()) {
		auto guard = pipeline.source_state->Lock();
		pipeline.source_state->PreventBlocking(guard);
		pipeline.source_state->UnblockTasks(guard);
	}
	if (pipeline.GetSink()) {
		auto guard = pipeline.GetSink()->sink_state->Lock();
		pipeline.GetSink()->sink_state->PreventBlocking(guard);
		pipeline.GetSink()->sink_state->UnblockTasks(guard);
	}
}